

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

void __thiscall pbrt::BilinearPatch::BilinearPatch(BilinearPatch *this,int meshIndex,int blpIndex)

{
  Point3<float> *this_00;
  undefined8 uVar1;
  int iVar2;
  BilinearPatch *pBVar3;
  bool bVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  Tuple3<pbrt::Point3,_float> *t1;
  Tuple3<pbrt::Point3,_float> *t0;
  long lVar8;
  Tuple3<pbrt::Point3,_float> *t0_00;
  Point3<float> *pPVar9;
  Point3<float> *p_00;
  int j;
  long in_FS_OFFSET;
  type tVar10;
  type tVar11;
  float t;
  undefined1 auVar12 [64];
  undefined1 auVar18 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [60];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 in_ZMM2 [64];
  Point3<float> PVar22;
  Vector3<float> VVar23;
  Tuple3<pbrt::Point3,_float> local_130;
  Tuple3<pbrt::Point3,_float> local_120;
  float local_114;
  BilinearPatch *local_110;
  long local_108;
  float *local_100;
  Point3f p [4] [4];
  
  this->meshIndex = meshIndex;
  this->blpIndex = blpIndex;
  *(long *)(in_FS_OFFSET + -0x478) = *(long *)(in_FS_OFFSET + -0x478) + 0xc;
  lVar8 = *(long *)(*(long *)(allMeshes + 8) + (long)meshIndex * 8);
  lVar6 = (long)(blpIndex << 2);
  lVar7 = *(long *)(lVar8 + 0x10);
  lVar8 = *(long *)(lVar8 + 0x18);
  iVar2 = *(int *)(lVar7 + 0xc + lVar6 * 4);
  t0 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar7 + lVar6 * 4) * 0xc + lVar8);
  t0_00 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar7 + 4 + lVar6 * 4) * 0xc + lVar8);
  t1 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar7 + 8 + lVar6 * 4) * 0xc + lVar8);
  bVar4 = IsRectangle(this);
  if (bVar4) {
    tVar10 = Distance<float>((Point3<float> *)t0,(Point3<float> *)t1);
    tVar11 = Distance<float>((Point3<float> *)t0,(Point3<float> *)t0_00);
    this->area = tVar11 * tVar10;
  }
  else {
    auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
    pfVar5 = &p[0][0].super_Tuple3<pbrt::Point3,_float>.z;
    lVar7 = 0;
    local_110 = this;
    p._0_64_ = auVar12;
    p._64_64_ = auVar12;
    p._128_64_ = auVar12;
    while (pBVar3 = local_110, lVar7 != 4) {
      local_114 = (float)(int)lVar7 / 3.0;
      auVar12 = ZEXT1664(CONCAT124(in_ZMM1._4_12_,local_114));
      local_108 = lVar7;
      local_100 = pfVar5;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        t = (float)(int)lVar6 / 3.0;
        auVar18 = ZEXT856(in_ZMM2._8_8_);
        auVar20 = ZEXT1260(in_ZMM1._4_12_);
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        PVar22 = Lerp<pbrt::Point3,float>(t,t0,t1);
        local_120.z = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
        auVar13._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar13._8_56_ = auVar18;
        local_120._0_8_ = vmovlps_avx(auVar13._0_16_);
        auVar18 = (undefined1  [56])0x0;
        PVar22 = Lerp<pbrt::Point3,float>
                           (t,t0_00,(Tuple3<pbrt::Point3,_float> *)(lVar8 + (long)iVar2 * 0xc));
        local_130.z = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
        auVar14._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar14._8_56_ = auVar18;
        local_130._0_8_ = vmovlps_avx(auVar14._0_16_);
        auVar18 = (undefined1  [56])0x0;
        PVar22 = Lerp<pbrt::Point3,float>(local_114,&local_120,&local_130);
        in_ZMM1._0_4_ = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
        in_ZMM1._4_60_ = auVar20;
        auVar12._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar12._8_56_ = auVar18;
        uVar1 = vmovlps_avx(auVar12._0_16_);
        ((Tuple3<pbrt::Point3,_float> *)(pfVar5 + -2))->x = (float)(int)uVar1;
        ((Tuple3<pbrt::Point3,_float> *)(pfVar5 + -2))->y = (float)(int)((ulong)uVar1 >> 0x20);
        *pfVar5 = in_ZMM1._0_4_;
        pfVar5 = pfVar5 + 3;
      }
      pfVar5 = local_100 + 0xc;
      lVar7 = local_108 + 1;
    }
    pPVar9 = p[0];
    lVar8 = 0;
    local_110->area = 0.0;
    while (lVar8 != 3) {
      lVar8 = lVar8 + 1;
      lVar7 = 3;
      p_00 = pPVar9;
      while (bVar4 = lVar7 != 0, lVar7 = lVar7 + -1, bVar4) {
        auVar18 = ZEXT856(auVar12._8_8_);
        auVar20 = ZEXT1260(in_ZMM1._4_12_);
        VVar23 = Point3<float>::operator-(p_00 + 5,p_00);
        local_120.z = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar15._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar15._8_56_ = auVar18;
        this_00 = p_00 + 4;
        p_00 = p_00 + 1;
        local_120._0_8_ = vmovlps_avx(auVar15._0_16_);
        VVar23 = Point3<float>::operator-(this_00,p_00);
        local_130.z = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar16._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar16._8_56_ = auVar18;
        local_130._0_8_ = vmovlps_avx(auVar16._0_16_);
        VVar23 = Cross<float>((Vector3<float> *)&local_120,(Vector3<float> *)&local_130);
        auVar19._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar19._4_60_ = auVar20;
        auVar17._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar17._8_56_ = auVar18;
        auVar21._0_4_ =
             VVar23.super_Tuple3<pbrt::Vector3,_float>.x *
             VVar23.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar21._4_4_ =
             VVar23.super_Tuple3<pbrt::Vector3,_float>.y *
             VVar23.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar21._8_4_ = auVar18._0_4_ * auVar18._0_4_;
        auVar21._12_4_ = auVar18._4_4_ * auVar18._4_4_;
        auVar21 = vmovshdup_avx(auVar21);
        auVar21 = vfmadd231ss_fma(auVar21,auVar17._0_16_,auVar17._0_16_);
        auVar21 = vfmadd231ss_fma(auVar21,auVar19._0_16_,auVar19._0_16_);
        in_ZMM1 = ZEXT464(0x3f000000);
        auVar21 = vsqrtss_avx(auVar21,auVar21);
        auVar21 = vfmadd213ss_fma(auVar21,in_ZMM1._0_16_,ZEXT416((uint)pBVar3->area));
        auVar12 = ZEXT1664(auVar21);
        pBVar3->area = auVar21._0_4_;
      }
      pPVar9 = pPVar9 + 4;
    }
  }
  return;
}

Assistant:

BilinearPatch::BilinearPatch(int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    if (IsRectangle())
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}